

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O2

int __thiscall Peers::accept(Peers *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Socket __fd_00;
  uint sockFd;
  ulong extraout_RAX;
  unique_ptr<Peer,_std::default_delete<Peer>_> peer;
  int num;
  socklen_t len;
  sockaddr_in addr;
  __uniq_ptr_impl<Peer,_std::default_delete<Peer>_> local_58;
  int local_4c;
  _Head_base<0UL,_Peer_*,_false> local_48;
  SocketResource local_40;
  socklen_t local_3c;
  sockaddr local_38;
  ulong uVar1;
  
  local_4c = this->m_count + 1;
  local_3c = 0x10;
  local_58._M_t.super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
  super__Head_base<0UL,_Peer_*,_false>._M_head_impl._0_4_ =
       P2PSocket::socket(this->m_p2pSocket,__fd,(int)__addr,(int)__addr_len);
  __fd_00 = SocketResource::resource((SocketResource *)&local_58);
  sockFd = ::accept(__fd_00,&local_38,&local_3c);
  uVar1 = (ulong)sockFd;
  if (sockFd != 0xffffffff) {
    SocketResource::SocketResource(&local_40,sockFd);
    std::make_unique<Peer,P2PSocket*&,SocketResource,int&>
              ((P2PSocket **)&local_58,(SocketResource *)&this->m_p2pSocket,&local_40.m_socket);
    local_48._M_head_impl =
         (Peer *)local_58._M_t.super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                 super__Head_base<0UL,_Peer_*,_false>._M_head_impl;
    local_58._M_t.super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
    super__Head_base<0UL,_Peer_*,_false>._M_head_impl =
         (tuple<Peer_*,_std::default_delete<Peer>_>)
         (_Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>)0x0;
    peerIsConnected(this,(unique_ptr<Peer,_std::default_delete<Peer>_> *)&local_48);
    std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr
              ((unique_ptr<Peer,_std::default_delete<Peer>_> *)&local_48);
    std::unique_ptr<Peer,_std::default_delete<Peer>_>::~unique_ptr
              ((unique_ptr<Peer,_std::default_delete<Peer>_> *)&local_58);
    uVar1 = extraout_RAX;
  }
  return (int)CONCAT71((int7)(uVar1 >> 8),sockFd != 0xffffffff);
}

Assistant:

bool Peers::accept()
{
    int num = m_count + 1;
    sockaddr_in addr;
#ifdef _WIN32
    int len = sizeof(addr);
#else
    socklen_t len = sizeof(addr);
#endif
    Socket peerSocket = ::accept(m_p2pSocket->socket().resource(), (struct sockaddr *)&addr, &len);
    if (peerSocket == INVALID_SOCKET)
        return false;
    std::unique_ptr<Peer> peer =
        std::make_unique<Peer>(m_p2pSocket, SocketResource(peerSocket), num);
    peerIsConnected(std::move(peer));
    return true;
}